

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Welcome.cpp
# Opt level: O0

void Handlers::Welcome_Agree(Player *player,PacketReader *reader)

{
  int iVar1;
  EOClient *pEVar2;
  uchar uVar3;
  runtime_error *this;
  bool local_1a;
  bool result;
  FileType file;
  PacketReader *reader_local;
  Player *player_local;
  
  uVar3 = PacketReader::GetChar(reader);
  switch(uVar3) {
  case '\x01':
    local_1a = EOClient::Upload(player->client,FILE_MAP,(int)player->character->mapid,INIT_FILE_MAP)
    ;
    break;
  case '\x02':
    pEVar2 = player->client;
    iVar1 = player->client->next_eif_id;
    player->client->next_eif_id = iVar1 + 1;
    local_1a = EOClient::Upload(pEVar2,FILE_ITEM,iVar1,INIT_FILE_EIF);
    break;
  case '\x03':
    pEVar2 = player->client;
    iVar1 = player->client->next_enf_id;
    player->client->next_enf_id = iVar1 + 1;
    local_1a = EOClient::Upload(pEVar2,FILE_NPC,iVar1,INIT_FILE_ENF);
    break;
  case '\x04':
    pEVar2 = player->client;
    iVar1 = player->client->next_esf_id;
    player->client->next_esf_id = iVar1 + 1;
    local_1a = EOClient::Upload(pEVar2,FILE_SPELL,iVar1,INIT_FILE_ESF);
    break;
  case '\x05':
    pEVar2 = player->client;
    iVar1 = player->client->next_ecf_id;
    player->client->next_ecf_id = iVar1 + 1;
    local_1a = EOClient::Upload(pEVar2,FILE_CLASS,iVar1,INIT_FILE_ECF);
    break;
  default:
    goto switchD_001cec27_default;
  }
  if (local_1a == false) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Failed to upload file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
switchD_001cec27_default:
  return;
}

Assistant:

void Welcome_Agree(Player *player, PacketReader &reader)
{
	FileType file = FileType(reader.GetChar());
	bool result = false;

	switch (file)
	{
		case FILE_MAP: result = player->client->Upload(FILE_MAP, player->character->mapid, INIT_FILE_MAP); break;
		case FILE_ITEM: result = player->client->Upload(FILE_ITEM, player->client->next_eif_id++, INIT_FILE_EIF); break;
		case FILE_NPC: result = player->client->Upload(FILE_NPC, player->client->next_enf_id++, INIT_FILE_ENF); break;
		case FILE_SPELL: result = player->client->Upload(FILE_SPELL, player->client->next_esf_id++, INIT_FILE_ESF); break;
		case FILE_CLASS: result = player->client->Upload(FILE_CLASS, player->client->next_ecf_id++, INIT_FILE_ECF); break;
		default: return;
	}

	if (!result)
		throw std::runtime_error("Failed to upload file");
}